

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int archive_write_mtree_close(archive_write *a)

{
  int iVar1;
  long in_RDI;
  archive_write *in_stack_00000008;
  int ret;
  mtree_writer *mtree;
  void *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  archive *_a;
  
  _a = *(archive **)(in_RDI + 0xd0);
  if (_a->vtable != (archive_vtable_conflict *)0x0) {
    iVar1 = write_mtree_entry_tree(in_stack_00000008);
    if (iVar1 != 0) {
      return -0x1e;
    }
    in_stack_ffffffffffffffe4 = 0;
  }
  archive_write_set_bytes_in_last_block(_a,in_stack_ffffffffffffffe4);
  iVar1 = __archive_write_output
                    ((archive_write *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8,0x2ad082);
  return iVar1;
}

Assistant:

static int
archive_write_mtree_close(struct archive_write *a)
{
	struct mtree_writer *mtree= a->format_data;
	int ret;

	if (mtree->root != NULL) {
		ret = write_mtree_entry_tree(a);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	archive_write_set_bytes_in_last_block(&a->archive, 1);

	return __archive_write_output(a, mtree->buf.s, mtree->buf.length);
}